

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O2

void __thiscall chrono::ChLinkClearance::ArchiveOUT(ChLinkClearance *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkClearance>(marchive);
  ChLinkLockLock::ArchiveOUT(&this->super_ChLinkLockLock,marchive);
  local_30._value = &this->clearance;
  local_30._name = "clearance";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->c_friction;
  local_48._name = "c_friction";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->c_restitution;
  local_60._name = "c_restitution";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->diameter;
  local_78._name = "diameter";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->c_tang_restitution;
  local_90._name = "c_tang_restitution";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->c_viscous;
  local_a8._name = "c_viscous";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  return;
}

Assistant:

void ChLinkClearance::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkClearance>();

    // serialize parent class
    ChLinkLockLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(clearance);
    marchive << CHNVP(c_friction);
    marchive << CHNVP(c_restitution);
    marchive << CHNVP(diameter);
    marchive << CHNVP(c_tang_restitution);
    marchive << CHNVP(c_viscous);
}